

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O0

int __thiscall OS_CoreSocket::get_local_addr(OS_CoreSocket *this,char **ip,int *port)

{
  int iVar1;
  long in_RDI;
  sockaddr_storage addr;
  socklen_t len;
  sockaddr local_a0 [3];
  int *in_stack_ffffffffffffff98;
  char **in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  sockaddr_storage *in_stack_ffffffffffffffb0;
  OS_CoreSocket *in_stack_ffffffffffffffb8;
  socklen_t local_1c [7];
  
  local_1c[0] = 0x80;
  getsockname(*(int *)(in_RDI + 0x18),local_a0,local_1c);
  iVar1 = parse_addr(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return iVar1;
}

Assistant:

int get_local_addr(char *&ip, int &port)
    {
        socklen_t len;
        struct sockaddr_storage addr;

        /* get the local socket information */
        len = sizeof(addr);
        getsockname(s, (struct sockaddr *)&addr, &len);

        /* parse the address */
        return parse_addr(addr, len, ip, port);
    }